

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw> *
perfetto::base::UnixSocketRaw::CreatePairPosix
          (pair<perfetto::base::UnixSocketRaw,_perfetto::base::UnixSocketRaw>
           *__return_storage_ptr__,SockFamily family,SockType type)

{
  ScopedSocketHandle SVar1;
  int iVar2;
  int __type;
  UnixSocketRaw *this;
  int fds [2];
  ScopedSocketHandle local_50;
  ScopedSocketHandle local_4c;
  UnixSocketRaw local_48;
  int local_38;
  int local_34;
  UnixSocketRaw local_30;
  
  iVar2 = anon_unknown_0::GetSockFamily(family);
  __type = anon_unknown_0::GetSockType(type);
  iVar2 = socketpair(iVar2,__type,0,&local_38);
  if (iVar2 == 0) {
    local_4c.t_ = local_38;
    UnixSocketRaw(&local_48,&local_4c,family,type);
    local_50.t_ = local_34;
    UnixSocketRaw(&local_30,&local_50,family,type);
    SVar1.t_ = local_48.fd_.t_;
    local_48.fd_.t_ = 0xffffffff;
    (__return_storage_ptr__->first).fd_.t_ = SVar1.t_;
    (__return_storage_ptr__->first).tx_timeout_ms_ = local_48.tx_timeout_ms_;
    (__return_storage_ptr__->first).family_ = local_48.family_;
    (__return_storage_ptr__->first).type_ = local_48.type_;
    (__return_storage_ptr__->second).fd_.t_ = local_30.fd_.t_;
    local_30.fd_.t_ = -1;
    (__return_storage_ptr__->second).tx_timeout_ms_ = local_30.tx_timeout_ms_;
    (__return_storage_ptr__->second).family_ = local_30.family_;
    (__return_storage_ptr__->second).type_ = local_30.type_;
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_30.fd_);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_50);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_48.fd_);
    this = (UnixSocketRaw *)&local_4c;
  }
  else {
    UnixSocketRaw(&local_48);
    UnixSocketRaw(&local_30);
    SVar1.t_ = local_48.fd_.t_;
    this = &local_48;
    local_48.fd_.t_ = 0xffffffff;
    (__return_storage_ptr__->first).fd_.t_ = SVar1.t_;
    (__return_storage_ptr__->first).tx_timeout_ms_ = local_48.tx_timeout_ms_;
    (__return_storage_ptr__->first).family_ = local_48.family_;
    (__return_storage_ptr__->first).type_ = local_48.type_;
    (__return_storage_ptr__->second).fd_.t_ = local_30.fd_.t_;
    local_30.fd_.t_ = -1;
    (__return_storage_ptr__->second).tx_timeout_ms_ = local_30.tx_timeout_ms_;
    (__return_storage_ptr__->second).family_ = local_30.family_;
    (__return_storage_ptr__->second).type_ = local_30.type_;
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_30.fd_);
  }
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->fd_);
  return __return_storage_ptr__;
}

Assistant:

std::pair<UnixSocketRaw, UnixSocketRaw> UnixSocketRaw::CreatePairPosix(
    SockFamily family,
    SockType type) {
  int fds[2];
  if (socketpair(GetSockFamily(family), GetSockType(type), 0, fds) != 0) {
    return std::make_pair(UnixSocketRaw(), UnixSocketRaw());
  }
  return std::make_pair(UnixSocketRaw(ScopedFile(fds[0]), family, type),
                        UnixSocketRaw(ScopedFile(fds[1]), family, type));
}